

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_benchmark.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  float cycle_per_op_10;
  uint64_t S_10;
  timespec ts_21;
  timespec ts_20;
  int i_8;
  int wrong_answer_8;
  uint64_t min_diff_8;
  uint64_t cycles_diff_10;
  uint64_t cycles_final_10;
  uint64_t cycles_start_10;
  float cycle_per_op_9;
  uint64_t S_9;
  timespec ts_19;
  timespec ts_18;
  int i_7;
  int wrong_answer_7;
  uint64_t min_diff_7;
  uint64_t cycles_diff_9;
  uint64_t cycles_final_9;
  uint64_t cycles_start_9;
  int x_3;
  int y;
  int length;
  int x_2;
  float cycle_per_op_8;
  uint64_t S_8;
  timespec ts_17;
  timespec ts_16;
  int i_6;
  int wrong_answer_6;
  uint64_t min_diff_6;
  uint64_t cycles_diff_8;
  uint64_t cycles_final_8;
  uint64_t cycles_start_8;
  float cycle_per_op_7;
  uint64_t S_7;
  timespec ts_15;
  timespec ts_14;
  int i_5;
  int wrong_answer_5;
  uint64_t min_diff_5;
  uint64_t cycles_diff_7;
  uint64_t cycles_final_7;
  uint64_t cycles_start_7;
  run_container_t *BO;
  int32_t inputsize;
  int x_1;
  run_container_t *B2;
  int x;
  run_container_t *B1;
  float cycle_per_op_6;
  uint64_t S_6;
  timespec ts_13;
  timespec ts_12;
  int i_4;
  int wrong_answer_4;
  uint64_t min_diff_4;
  uint64_t cycles_diff_6;
  uint64_t cycles_final_6;
  uint64_t cycles_start_6;
  uint32_t *out_1;
  int card_1;
  int32_t nruns_less;
  int32_t nruns_greater;
  uint16_t max;
  uint16_t min;
  int j_3;
  run_container_t *Bt_1;
  int howmany_1;
  float cycle_per_op_5;
  uint64_t S_5;
  timespec ts_11;
  timespec ts_10;
  size_t j_2;
  int sum_1;
  uint64_t cycles_diff_5;
  uint64_t cycles_final_5;
  uint64_t cycles_start_5;
  float cycle_per_op_4;
  uint64_t S_4;
  timespec ts_9;
  timespec ts_8;
  size_t j_1;
  int sum;
  uint64_t cycles_diff_4;
  uint64_t cycles_final_4;
  uint64_t cycles_start_4;
  float cycle_per_op_3;
  uint64_t S_3;
  timespec ts_7;
  timespec ts_6;
  int i_3;
  int wrong_answer_3;
  uint64_t min_diff_3;
  uint64_t cycles_diff_3;
  uint64_t cycles_final_3;
  uint64_t cycles_start_3;
  uint32_t *out;
  int card;
  uint16_t *testvalues;
  size_t nbrtestvalues;
  int j;
  run_container_t *Bt;
  int howmany;
  float cycle_per_op_2;
  uint64_t S_2;
  timespec ts_5;
  timespec ts_4;
  int i_2;
  int wrong_answer_2;
  uint64_t min_diff_2;
  uint64_t cycles_diff_2;
  uint64_t cycles_final_2;
  uint64_t cycles_start_2;
  float cycle_per_op_1;
  uint64_t S_1;
  timespec ts_3;
  timespec ts_2;
  int i_1;
  int wrong_answer_1;
  uint64_t min_diff_1;
  uint64_t cycles_diff_1;
  uint64_t cycles_final_1;
  uint64_t cycles_start_1;
  int answer;
  float cycle_per_op;
  uint64_t S;
  timespec ts_1;
  timespec ts;
  int i;
  int wrong_answer;
  uint64_t min_diff;
  uint64_t cycles_diff;
  uint64_t cycles_final;
  uint64_t cycles_start;
  run_container_t *B;
  int size;
  int repeat;
  undefined4 in_stack_fffffffffffffaa8;
  uint32_t in_stack_fffffffffffffaac;
  undefined4 in_stack_fffffffffffffab0;
  undefined2 in_stack_fffffffffffffab4;
  uint16_t in_stack_fffffffffffffab6;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  int32_t in_stack_fffffffffffffac0;
  int32_t in_stack_fffffffffffffac4;
  uint32_t in_stack_fffffffffffffac8;
  uint32_t in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  float local_518;
  float local_510;
  float local_504;
  float local_4fc;
  float local_4e8;
  float local_4e0;
  float local_4d4;
  float local_4c8;
  float local_4bc;
  float local_4b4;
  float local_4a0;
  float local_498;
  float local_48c;
  float local_484;
  float local_478;
  float local_470;
  timespec local_460;
  timespec local_450;
  int local_440;
  int local_43c;
  ulong local_438;
  ulong local_430;
  long local_428;
  long local_420;
  float local_414;
  ulong local_410;
  timespec local_408;
  timespec local_3f8;
  int local_3e8;
  int local_3e4;
  ulong local_3e0;
  ulong local_3d8;
  long local_3d0;
  long local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  float local_3ac;
  ulong local_3a8;
  timespec local_3a0;
  timespec local_390;
  int local_380;
  int local_37c;
  ulong local_378;
  ulong local_370;
  long local_368;
  long local_360;
  float local_354;
  ulong local_350;
  timespec local_348;
  timespec local_338;
  int local_328;
  int local_324;
  ulong local_320;
  ulong local_318;
  long local_310;
  long local_308;
  run_container_t *local_300;
  int local_2f8;
  int local_2f4;
  run_container_t *local_2f0;
  int local_2e4;
  run_container_t *local_2e0;
  float local_2d4;
  ulong local_2d0;
  timespec local_2c8;
  timespec local_2b8;
  int local_2a8;
  int local_2a4;
  ulong local_2a0;
  ulong local_298;
  long local_290;
  long local_288;
  void *local_280;
  int local_274;
  int32_t local_270;
  int32_t local_26c;
  uint16_t local_268;
  uint16_t local_266;
  int local_264;
  run_container_t *local_260;
  int local_258;
  float local_254;
  ulong local_250;
  timespec local_248;
  timespec local_238;
  ulong local_228;
  int local_21c;
  long local_218;
  long local_210;
  long local_208;
  float local_1fc;
  ulong local_1f8;
  timespec local_1f0;
  timespec local_1e0;
  ulong local_1d0;
  int local_1c4;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  float local_1a4;
  ulong local_1a0;
  timespec local_198;
  timespec local_188;
  int local_178;
  int local_174;
  ulong local_170;
  ulong local_168;
  long local_160;
  long local_158;
  void *local_150;
  int local_144;
  void *local_140;
  ulong local_138;
  int local_12c;
  run_container_t *local_128;
  int local_120;
  float local_11c;
  ulong local_118;
  timespec local_110;
  timespec local_100;
  int local_f0;
  int local_ec;
  ulong local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  float local_c4;
  ulong local_c0;
  timespec local_b8;
  timespec local_a8;
  int local_98;
  int local_94;
  ulong local_90;
  ulong local_88;
  long local_80;
  long local_78;
  uint local_70;
  float local_6c;
  ulong local_68;
  timespec local_60;
  timespec local_50;
  int local_40;
  int local_3c;
  ulong local_38;
  ulong local_30;
  long local_28;
  long local_20;
  run_container_t *local_18;
  int local_c;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_8 = 500;
  local_c = 0x800;
  tellmeall();
  printf("run container benchmarks\n");
  local_18 = run_container_create();
  printf("%s: ","add_test(B)");
  fflush((FILE *)0x0);
  local_38 = 0xffffffffffffffff;
  local_3c = 0;
  for (local_40 = 0; local_40 < local_8; local_40 = local_40 + 1) {
    clock_gettime(3,&local_50);
    local_20 = local_50.tv_sec * 1000000000 + local_50.tv_nsec;
    iVar1 = add_test((run_container_t *)
                     CONCAT26(in_stack_fffffffffffffab6,
                              CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)));
    if (iVar1 != 0) {
      local_3c = 1;
    }
    clock_gettime(3,&local_60);
    local_28 = local_60.tv_sec * 1000000000 + local_60.tv_nsec;
    local_30 = local_28 - local_20;
    if (local_30 < local_38) {
      local_38 = local_30;
    }
  }
  local_68 = (ulong)local_c;
  local_470 = (float)local_38;
  local_478 = (float)local_68;
  local_6c = local_470 / local_478;
  printf(" %.2f cycles per operation",(double)local_6c);
  if (local_3c != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_70 = contains_test((run_container_t *)
                           CONCAT26(in_stack_fffffffffffffab6,
                                    CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)));
  local_c = 0x10000;
  printf("%s: ","contains_test(B)");
  fflush((FILE *)0x0);
  local_90 = 0xffffffffffffffff;
  local_94 = 0;
  for (local_98 = 0; local_98 < local_8; local_98 = local_98 + 1) {
    clock_gettime(3,&local_a8);
    local_78 = local_a8.tv_sec * 1000000000 + local_a8.tv_nsec;
    iVar1 = contains_test((run_container_t *)
                          CONCAT26(in_stack_fffffffffffffab6,
                                   CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)));
    if (iVar1 != local_70) {
      local_94 = 1;
    }
    clock_gettime(3,&local_b8);
    local_80 = local_b8.tv_sec * 1000000000 + local_b8.tv_nsec;
    local_88 = local_80 - local_78;
    if (local_88 < local_90) {
      local_90 = local_88;
    }
  }
  local_c0 = (ulong)local_c;
  local_484 = (float)local_90;
  local_48c = (float)local_c0;
  local_c4 = local_484 / local_48c;
  printf(" %.2f cycles per operation",(double)local_c4);
  if (local_94 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_c = 0x5555;
  printf("%s: ","remove_test(B)");
  fflush((FILE *)0x0);
  local_e8 = 0xffffffffffffffff;
  local_ec = 0;
  for (local_f0 = 0; local_f0 < local_8; local_f0 = local_f0 + 1) {
    clock_gettime(3,&local_100);
    local_d0 = local_100.tv_sec * 1000000000 + local_100.tv_nsec;
    iVar1 = remove_test((run_container_t *)
                        CONCAT26(in_stack_fffffffffffffab6,
                                 CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)));
    if (iVar1 != 0) {
      local_ec = 1;
    }
    clock_gettime(3,&local_110);
    local_d8 = local_110.tv_sec * 1000000000 + local_110.tv_nsec;
    local_e0 = local_d8 - local_d0;
    if (local_e0 < local_e8) {
      local_e8 = local_e0;
    }
  }
  local_118 = (ulong)local_c;
  local_498 = (float)local_e8;
  local_4a0 = (float)local_118;
  local_11c = local_498 / local_4a0;
  printf(" %.2f cycles per operation",(double)local_11c);
  if (local_ec != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  run_container_free((run_container_t *)0x10190b);
  for (local_120 = 0x20; local_120 < 0x10001; local_120 = local_120 << 3) {
    local_128 = run_container_create();
    for (local_12c = 0; local_12c < local_120; local_12c = local_12c + 1) {
      pcg32_random();
      run_container_add((run_container_t *)
                        CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                        in_stack_fffffffffffffab6);
    }
    local_138 = 0x400;
    local_140 = malloc(0x800);
    uVar2 = run_container_cardinality
                      ((run_container_t *)
                       CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    printf("\n number of values in container = %d\n",(ulong)uVar2);
    local_144 = run_container_cardinality
                          ((run_container_t *)
                           CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_150 = malloc((long)local_144 << 2);
    printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
    fflush((FILE *)0x0);
    local_170 = 0xffffffffffffffff;
    local_174 = 0;
    for (local_178 = 0; local_178 < local_8; local_178 = local_178 + 1) {
      clock_gettime(3,&local_188);
      local_158 = local_188.tv_sec * 1000000000 + local_188.tv_nsec;
      iVar1 = run_container_to_uint32_array
                        ((void *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                         (run_container_t *)
                         CONCAT26(in_stack_fffffffffffffab6,
                                  CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)),
                         in_stack_fffffffffffffaac);
      if (iVar1 != local_144) {
        local_174 = 1;
      }
      clock_gettime(3,&local_198);
      local_160 = local_198.tv_sec * 1000000000 + local_198.tv_nsec;
      local_168 = local_160 - local_158;
      if (local_168 < local_170) {
        local_170 = local_168;
      }
    }
    local_1a0 = (ulong)local_144;
    local_4b4 = (float)local_170;
    local_4bc = (float)local_1a0;
    local_1a4 = local_4b4 / local_4bc;
    printf(" %.2f cycles per operation",(double)local_1a4);
    if (local_174 != 0) {
      printf(" [ERROR]");
    }
    printf("\n");
    fflush((FILE *)0x0);
    free(local_150);
    printf("%s %s: ","run_container_contains","run_cache_prefetch");
    fflush((FILE *)0x0);
    local_1c4 = 0;
    for (local_1d0 = 0; local_1d0 < local_138; local_1d0 = local_1d0 + 1) {
      run_cache_prefetch((run_container_t *)
                         CONCAT26(in_stack_fffffffffffffab6,
                                  CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)));
      clock_gettime(3,&local_1e0);
      local_1b0 = local_1e0.tv_sec * 1000000000 + local_1e0.tv_nsec;
      run_container_contains
                ((run_container_t *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 in_stack_fffffffffffffab6);
      clock_gettime(3,&local_1f0);
      local_1b8 = local_1f0.tv_sec * 1000000000 + local_1f0.tv_nsec;
      local_1c0 = local_1b8 - local_1b0;
      local_1c4 = local_1c4 + (int)local_1c0;
    }
    local_1f8 = local_138;
    local_4c8 = (float)local_138;
    local_1fc = (float)local_1c4 / local_4c8;
    printf(" %.2f cycles per operation",(double)local_1fc);
    printf("\n");
    fflush((FILE *)0x0);
    printf("%s %s: ","run_container_contains","run_cache_flush");
    fflush((FILE *)0x0);
    local_21c = 0;
    for (local_228 = 0; local_228 < local_138; local_228 = local_228 + 1) {
      run_cache_flush((run_container_t *)
                      CONCAT26(in_stack_fffffffffffffab6,
                               CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)));
      clock_gettime(3,&local_238);
      local_208 = local_238.tv_sec * 1000000000 + local_238.tv_nsec;
      run_container_contains
                ((run_container_t *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 in_stack_fffffffffffffab6);
      clock_gettime(3,&local_248);
      local_210 = local_248.tv_sec * 1000000000 + local_248.tv_nsec;
      local_218 = local_210 - local_208;
      local_21c = local_21c + (int)local_218;
    }
    local_250 = local_138;
    local_4d4 = (float)local_138;
    local_254 = (float)local_21c / local_4d4;
    printf(" %.2f cycles per operation",(double)local_254);
    printf("\n");
    fflush((FILE *)0x0);
    free(local_140);
    run_container_free((run_container_t *)0x10203f);
  }
  printf("==dense range test \n");
  for (local_258 = 0x20; local_258 < 0x10001; local_258 = local_258 << 3) {
    local_260 = run_container_create();
    for (local_264 = 0; local_264 < local_258; local_264 = local_264 + 1) {
      uVar3 = pcg32_random();
      local_266 = (uint16_t)((ulong)(uVar3 & 0xffff) % 0x1000);
      local_268 = local_266 + 0x1000;
      local_26c = rle16_count_greater(local_260->runs,local_260->n_runs,local_268);
      local_270 = rle16_count_less(local_260->runs,local_260->n_runs - local_26c,local_266);
      run_container_add_range_nruns
                ((run_container_t *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffacc,in_stack_fffffffffffffac8,in_stack_fffffffffffffac4,
                 in_stack_fffffffffffffac0);
    }
    uVar2 = run_container_cardinality
                      ((run_container_t *)
                       CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    printf("\n number of values in container = %d\n",(ulong)uVar2);
    local_274 = run_container_cardinality
                          ((run_container_t *)
                           CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_280 = malloc((long)local_274 << 2);
    printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
    fflush((FILE *)0x0);
    local_2a0 = 0xffffffffffffffff;
    local_2a4 = 0;
    for (local_2a8 = 0; local_2a8 < local_8; local_2a8 = local_2a8 + 1) {
      clock_gettime(3,&local_2b8);
      local_288 = local_2b8.tv_sec * 1000000000 + local_2b8.tv_nsec;
      iVar1 = run_container_to_uint32_array
                        ((void *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                         (run_container_t *)
                         CONCAT26(in_stack_fffffffffffffab6,
                                  CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)),
                         in_stack_fffffffffffffaac);
      if (iVar1 != local_274) {
        local_2a4 = 1;
      }
      clock_gettime(3,&local_2c8);
      local_290 = local_2c8.tv_sec * 1000000000 + local_2c8.tv_nsec;
      local_298 = local_290 - local_288;
      if (local_298 < local_2a0) {
        local_2a0 = local_298;
      }
    }
    local_2d0 = (ulong)local_274;
    local_4e0 = (float)local_2a0;
    local_4e8 = (float)local_2d0;
    local_2d4 = local_4e0 / local_4e8;
    printf(" %.2f cycles per operation",(double)local_2d4);
    if (local_2a4 != 0) {
      printf(" [ERROR]");
    }
    printf("\n");
    fflush((FILE *)0x0);
    free(local_280);
    run_container_free((run_container_t *)0x102411);
  }
  printf("\n");
  local_2e0 = run_container_create();
  for (local_2e4 = 0; local_2e4 < 0x10000; local_2e4 = local_2e4 + 3) {
    run_container_add((run_container_t *)
                      CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                      in_stack_fffffffffffffab6);
  }
  local_2f0 = run_container_create();
  for (local_2f4 = 0; local_2f4 < 0x10000; local_2f4 = local_2f4 + 5) {
    run_container_add((run_container_t *)
                      CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                      in_stack_fffffffffffffab6);
  }
  local_2f8 = local_2e0->n_runs + local_2f0->n_runs;
  local_300 = run_container_create();
  printf("\nUnion and intersections...\n");
  printf("\nNote:\n");
  printf("union times are expressed in cycles per number of input elements (both runs)\n");
  printf("intersection times are expressed in cycles per number of output elements\n\n");
  printf("==intersection and union test 1 \n");
  uVar2 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  uVar4 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar2,(ulong)uVar4);
  local_70 = union_test((run_container_t *)
                        CONCAT26(in_stack_fffffffffffffab6,
                                 CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)),
                        (run_container_t *)
                        CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                        (run_container_t *)0x102590);
  printf("union cardinality = %d \n",(ulong)local_70);
  uVar2 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  uVar4 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  printf("B1 card = %d B2 card = %d \n",(ulong)uVar2,(ulong)uVar4);
  local_2f8 = local_2e0->n_runs + local_2f0->n_runs;
  printf("%s: ","union_test(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_320 = 0xffffffffffffffff;
  local_324 = 0;
  for (local_328 = 0; local_328 < local_8; local_328 = local_328 + 1) {
    clock_gettime(3,&local_338);
    local_308 = local_338.tv_sec * 1000000000 + local_338.tv_nsec;
    uVar2 = union_test((run_container_t *)
                       CONCAT26(in_stack_fffffffffffffab6,
                                CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)),
                       (run_container_t *)
                       CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                       (run_container_t *)0x10269a);
    if (uVar2 != local_70) {
      local_324 = 1;
    }
    clock_gettime(3,&local_348);
    local_310 = local_348.tv_sec * 1000000000 + local_348.tv_nsec;
    local_318 = local_310 - local_308;
    if (local_318 < local_320) {
      local_320 = local_318;
    }
  }
  local_350 = (ulong)local_2f8;
  local_4fc = (float)local_320;
  local_504 = (float)local_350;
  local_354 = local_4fc / local_504;
  printf(" %.2f cycles per operation",(double)local_354);
  if (local_324 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_70 = intersection_test((run_container_t *)
                               CONCAT26(in_stack_fffffffffffffab6,
                                        CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0
                                                )),
                               (run_container_t *)
                               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                               (run_container_t *)0x10284e);
  printf("intersection cardinality = %d \n",(ulong)local_70);
  printf("%s: ","intersection_test(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_378 = 0xffffffffffffffff;
  local_37c = 0;
  for (local_380 = 0; local_380 < local_8; local_380 = local_380 + 1) {
    clock_gettime(3,&local_390);
    local_360 = local_390.tv_sec * 1000000000 + local_390.tv_nsec;
    uVar2 = intersection_test((run_container_t *)
                              CONCAT26(in_stack_fffffffffffffab6,
                                       CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)
                                      ),
                              (run_container_t *)
                              CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                              (run_container_t *)0x10290b);
    if (uVar2 != local_70) {
      local_37c = 1;
    }
    clock_gettime(3,&local_3a0);
    local_368 = local_3a0.tv_sec * 1000000000 + local_3a0.tv_nsec;
    local_370 = local_368 - local_360;
    if (local_370 < local_378) {
      local_378 = local_370;
    }
  }
  local_3a8 = (ulong)(int)local_70;
  local_510 = (float)local_378;
  local_518 = (float)local_3a8;
  local_3ac = local_510 / local_518;
  printf(" %.2f cycles per operation",(double)local_3ac);
  if (local_37c != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("==intersection and union test 2 \n");
  local_2e0->n_runs = 0;
  local_2f0->n_runs = 0;
  for (local_3b0 = 0; local_3b0 < 0x10000; local_3b0 = local_3b0 + 0x40) {
    local_3b4 = local_3b0 % 0xb;
    for (local_3b8 = 0; local_3b8 < local_3b4; local_3b8 = local_3b8 + 1) {
      run_container_add((run_container_t *)
                        CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                        in_stack_fffffffffffffab6);
    }
  }
  for (local_3bc = 1; local_3bc < 0x10000; local_3bc = local_3bc * 2) {
    run_container_add((run_container_t *)
                      CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                      in_stack_fffffffffffffab6);
  }
  uVar2 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  uVar4 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar2,(ulong)uVar4);
  local_70 = union_test((run_container_t *)
                        CONCAT26(in_stack_fffffffffffffab6,
                                 CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)),
                        (run_container_t *)
                        CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                        (run_container_t *)0x102bf3);
  printf("union cardinality = %d \n",(ulong)local_70);
  uVar2 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  uVar4 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  printf("B1 card = %d B2 card = %d \n",(ulong)uVar2,(ulong)uVar4);
  local_2f8 = local_2e0->n_runs + local_2f0->n_runs;
  printf("%s: ","union_test(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_3e0 = 0xffffffffffffffff;
  local_3e4 = 0;
  for (local_3e8 = 0; local_3e8 < local_8; local_3e8 = local_3e8 + 1) {
    clock_gettime(3,&local_3f8);
    local_3c8 = local_3f8.tv_sec * 1000000000 + local_3f8.tv_nsec;
    uVar2 = union_test((run_container_t *)
                       CONCAT26(in_stack_fffffffffffffab6,
                                CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)),
                       (run_container_t *)
                       CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                       (run_container_t *)0x102cfd);
    if (uVar2 != local_70) {
      local_3e4 = 1;
    }
    clock_gettime(3,&local_408);
    local_3d0 = local_408.tv_sec * 1000000000 + local_408.tv_nsec;
    local_3d8 = local_3d0 - local_3c8;
    if (local_3d8 < local_3e0) {
      local_3e0 = local_3d8;
    }
  }
  local_410 = (ulong)local_2f8;
  local_414 = (float)local_3e0 / (float)local_410;
  printf(" %.2f cycles per operation",(double)local_414);
  if (local_3e4 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_70 = intersection_test((run_container_t *)
                               CONCAT26(in_stack_fffffffffffffab6,
                                        CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0
                                                )),
                               (run_container_t *)
                               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                               (run_container_t *)0x102eb1);
  printf("intersection cardinality = %d \n",(ulong)local_70);
  printf("%s: ","intersection_test(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_438 = 0xffffffffffffffff;
  local_43c = 0;
  for (local_440 = 0; local_440 < local_8; local_440 = local_440 + 1) {
    clock_gettime(3,&local_450);
    local_420 = local_450.tv_sec * 1000000000 + local_450.tv_nsec;
    uVar2 = intersection_test((run_container_t *)
                              CONCAT26(in_stack_fffffffffffffab6,
                                       CONCAT24(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)
                                      ),
                              (run_container_t *)
                              CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                              (run_container_t *)0x102f6e);
    if (uVar2 != local_70) {
      local_43c = 1;
    }
    clock_gettime(3,&local_460);
    local_428 = local_460.tv_sec * 1000000000 + local_460.tv_nsec;
    local_430 = local_428 - local_420;
    if (local_430 < local_438) {
      local_438 = local_430;
    }
  }
  printf(" %.2f cycles per operation",(double)((float)local_438 / (float)(ulong)(long)(int)local_70)
        );
  if (local_43c != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  run_container_free((run_container_t *)0x103112);
  run_container_free((run_container_t *)0x10311f);
  run_container_free((run_container_t *)0x10312c);
  return 0;
}

Assistant:

int main() {
    int repeat = 500;
    int size = TESTSIZE;
    tellmeall();
    printf("run container benchmarks\n");
    run_container_t* B = run_container_create();
    BEST_TIME(add_test(B), 0, repeat, size);
    int answer = contains_test(B);
    size = 1 << 16;
    BEST_TIME(contains_test(B), answer, repeat, size);
    size = (1 << 16) / 3;
    BEST_TIME(remove_test(B), 0, repeat, size);
    run_container_free(B);

    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            run_container_add(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        run_container_free(Bt);
    }

    printf("==dense range test \n");
    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            uint16_t min = (uint16_t)pcg32_random() % 4096;
            uint16_t max = min + 4096;
            int32_t nruns_greater =
                rle16_count_greater(Bt->runs, Bt->n_runs, max);
            int32_t nruns_less =
                rle16_count_less(Bt->runs, Bt->n_runs - nruns_greater, min);
            run_container_add_range_nruns(Bt, min, max, nruns_less,
                                          nruns_greater);
        }
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);

        run_container_free(Bt);
    }

    printf("\n");

    run_container_t* B1 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        run_container_add(B1, (uint16_t)x);
    }
    run_container_t* B2 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        run_container_add(B2, (uint16_t)x);
    }
    int32_t inputsize;
    inputsize = B1->n_runs + B2->n_runs;
    run_container_t* BO = run_container_create();
    printf("\nUnion and intersections...\n");
    printf("\nNote:\n");
    printf(
        "union times are expressed in cycles per number of input elements "
        "(both runs)\n");
    printf(
        "intersection times are expressed in cycles per number of output "
        "elements\n\n");
    printf("==intersection and union test 1 \n");
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;
    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);
    printf("==intersection and union test 2 \n");
    B1->n_runs = 0;
    B2->n_runs = 0;
    for (int x = 0; x < (1 << 16); x += 64) {
        int length = x % 11;
        for (int y = 0; y < length; ++y)
            run_container_add(B1, (uint16_t)(x + y));
    }
    for (int x = 1; x < 1 << 16; x += x) {
        run_container_add(B2, (uint16_t)x);
    }
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;

    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);

    run_container_free(B1);
    run_container_free(B2);
    run_container_free(BO);
    return 0;
}